

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O3

void write_cb(uv_write_t *req,int status)

{
  void *pvVar1;
  undefined8 *extraout_RDX;
  undefined4 in_register_00000034;
  uv_shutdown_t *puVar2;
  
  if (req == (uv_write_t *)0x0) {
    write_cb_cold_2();
  }
  else if (status == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  puVar2 = (uv_shutdown_t *)(ulong)(uint)status;
  write_cb_cold_1();
  if (puVar2 == &shutdown_req) {
    if (status != 0) goto LAB_00175372;
    if ((shutdown_req.handle)->write_queue_size == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      if (write_cb_called == 3) {
        return;
      }
      goto LAB_0017537c;
    }
  }
  else {
    shutdown_cb_cold_1();
LAB_00175372:
    shutdown_cb_cold_2();
  }
  shutdown_cb_cold_3();
LAB_0017537c:
  shutdown_cb_cold_4();
  pvVar1 = malloc(CONCAT44(in_register_00000034,status));
  *extraout_RDX = pvVar1;
  extraout_RDX[1] = CONCAT44(in_register_00000034,status);
  return;
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  /* write callbacks should run before the close callback */
  ASSERT(close_cb_called == 0);
  ASSERT(req->handle == (uv_stream_t*)&tcp_handle);
  write_cb_called++;
  free(req);
}